

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void SetLastParsedLabel(char *label)

{
  char *label_local;
  
  if (LastParsedLabel != (char *)0x0) {
    free(LastParsedLabel);
  }
  if (label == (char *)0x0) {
    LastParsedLabel = (char *)0x0;
    LastParsedLabelLine = 0;
  }
  else {
    LastParsedLabel = strdup(label);
    if (LastParsedLabel == (char *)0x0) {
      ErrorOOM();
    }
    LastParsedLabelLine = CompiledCurrentLine;
  }
  return;
}

Assistant:

void SetLastParsedLabel(const char* label) {
	if (LastParsedLabel) free(LastParsedLabel);
	if (nullptr != label) {
		LastParsedLabel = STRDUP(label);
		if (nullptr == LastParsedLabel) ErrorOOM();
		LastParsedLabelLine = CompiledCurrentLine;
	} else {
		LastParsedLabel = nullptr;
		LastParsedLabelLine = 0;
	}
}